

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParsePool(ManifestParser *this,string *err)

{
  pointer *key_00;
  EvalString *this_00;
  State *this_01;
  bool bVar1;
  Pool *pPVar2;
  char *__nptr;
  long lVar3;
  allocator<char> local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  string depth_string;
  EvalString value;
  string key;
  undefined1 local_b8 [4];
  int depth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  uint local_78;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  string name;
  string *err_local;
  ManifestParser *this_local;
  
  name.field_2._8_8_ = err;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = Lexer::ReadIdent(&(this->super_Parser).lexer_,(string *)local_40);
  if (bVar1) {
    bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,(string *)name.field_2._8_8_);
    if (bVar1) {
      pPVar2 = State::LookupPool((this->super_Parser).state_,(string *)local_40);
      if (pPVar2 == (Pool *)0x0) {
        key.field_2._12_4_ = 0xffffffff;
        do {
          bVar1 = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
          if (!bVar1) {
            if ((int)key.field_2._12_4_ < 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a0,"expected \'depth =\' line",&local_1a1);
              this_local._7_1_ =
                   Lexer::Error(&(this->super_Parser).lexer_,&local_1a0,(string *)name.field_2._8_8_
                               );
              std::__cxx11::string::~string((string *)&local_1a0);
              std::allocator<char>::~allocator(&local_1a1);
              local_78 = 1;
            }
            else {
              this_01 = (this->super_Parser).state_;
              pPVar2 = (Pool *)operator_new(0x58);
              Pool::Pool(pPVar2,(string *)local_40,key.field_2._12_4_);
              State::AddPool(this_01,pPVar2);
              this_local._7_1_ = 1;
              local_78 = 1;
            }
            break;
          }
          key_00 = &value.parsed_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)key_00);
          this_00 = (EvalString *)((long)&depth_string.field_2 + 8);
          EvalString::EvalString(this_00);
          bVar1 = ParseLet(this,(string *)key_00,this_00,(string *)name.field_2._8_8_);
          if (bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&value.parsed_.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"depth");
            if (bVar1) {
              EvalString::Evaluate_abi_cxx11_
                        ((string *)local_118,(EvalString *)((long)&depth_string.field_2 + 8),
                         &this->env_->super_Env);
              __nptr = (char *)std::__cxx11::string::c_str();
              lVar3 = atol(__nptr);
              key.field_2._12_4_ = (undefined4)lVar3;
              if ((int)key.field_2._12_4_ < 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_138,"invalid pool depth",&local_139);
                this_local._7_1_ =
                     Lexer::Error(&(this->super_Parser).lexer_,&local_138,
                                  (string *)name.field_2._8_8_);
                std::__cxx11::string::~string((string *)&local_138);
                std::allocator<char>::~allocator(&local_139);
              }
              local_78 = (uint)((int)key.field_2._12_4_ < 0);
              std::__cxx11::string::~string((string *)local_118);
              if (local_78 == 0) {
                local_78 = 0;
              }
            }
            else {
              std::operator+(&local_180,"unexpected variable \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &value.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::operator+(&local_160,&local_180,"\'");
              this_local._7_1_ =
                   Lexer::Error(&(this->super_Parser).lexer_,&local_160,(string *)name.field_2._8_8_
                               );
              std::__cxx11::string::~string((string *)&local_160);
              std::__cxx11::string::~string((string *)&local_180);
              local_78 = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            local_78 = 1;
          }
          EvalString::~EvalString((EvalString *)((long)&depth_string.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)
                     &value.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        } while (local_78 == 0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"duplicate pool \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"\'");
        this_local._7_1_ =
             Lexer::Error(&(this->super_Parser).lexer_,&local_98,(string *)name.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)local_b8);
        local_78 = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      local_78 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"expected pool name",&local_71);
    this_local._7_1_ =
         Lexer::Error(&(this->super_Parser).lexer_,&local_70,(string *)name.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    local_78 = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ManifestParser::ParsePool(string* err) {
  string name;
  if (!lexer_.ReadIdent(&name))
    return lexer_.Error("expected pool name", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (state_->LookupPool(name) != NULL)
    return lexer_.Error("duplicate pool '" + name + "'", err);

  int depth = -1;

  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString value;
    if (!ParseLet(&key, &value, err))
      return false;

    if (key == "depth") {
      string depth_string = value.Evaluate(env_);
      depth = atol(depth_string.c_str());
      if (depth < 0)
        return lexer_.Error("invalid pool depth", err);
    } else {
      return lexer_.Error("unexpected variable '" + key + "'", err);
    }
  }

  if (depth < 0)
    return lexer_.Error("expected 'depth =' line", err);

  state_->AddPool(new Pool(name, depth));
  return true;
}